

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_functor::binary_op_div>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_d4;
  float *local_c0;
  undefined1 (*local_b8) [16];
  __m128 _outp;
  __m128 _b;
  __m128 _a_128;
  int i;
  float a;
  binary_op_div op;
  int elempack_local;
  int size_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  
  fVar1 = *ptr;
  local_d4 = 0;
  local_c0 = outptr;
  local_b8 = (undefined1 (*) [16])ptr1;
  if (elempack == 4) {
    local_118 = *(undefined8 *)ptr;
    uStack_110 = *(undefined8 *)(ptr + 2);
  }
  else {
    local_118 = CONCAT44(fVar1,fVar1);
    uStack_110 = CONCAT44(fVar1,fVar1);
  }
  for (; local_d4 + 3 < size; local_d4 = local_d4 + 4) {
    auVar2._8_8_ = uStack_110;
    auVar2._0_8_ = local_118;
    auVar2 = divps(auVar2,*local_b8);
    local_108 = auVar2._0_8_;
    uStack_100 = auVar2._8_8_;
    *(undefined8 *)local_c0 = local_108;
    *(undefined8 *)(local_c0 + 2) = uStack_100;
    local_b8 = local_b8 + 1;
    local_c0 = local_c0 + 4;
  }
  for (; local_d4 < size; local_d4 = local_d4 + 1) {
    *local_c0 = fVar1 / *(float *)*local_b8;
    local_b8 = (undefined1 (*) [16])(*local_b8 + 4);
    local_c0 = local_c0 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}